

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O3

void RVO::linearProgram4(vector<RVO::Plane,_std::allocator<RVO::Plane>_> *planes,size_t numObstacles
                        ,size_t beginPlane,float radius,Vector3 *result)

{
  undefined8 uVar1;
  undefined8 uVar2;
  pointer pPVar3;
  pointer pPVar4;
  ulong uVar5;
  long lVar6;
  __normal_iterator<const_RVO::Plane_*,_std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>_>
  __first;
  size_t sVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  vector<RVO::Plane,_std::allocator<RVO::Plane>_> projPlanes;
  value_type local_88;
  vector<RVO::Plane,_std::allocator<RVO::Plane>_> local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  long local_40;
  long local_38;
  
  __first._M_current =
       (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pPVar4 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = ((long)pPVar4 - (long)__first._M_current >> 3) * -0x5555555555555555;
  if (beginPlane <= uVar5 && uVar5 - beginPlane != 0) {
    local_38 = numObstacles * 3;
    local_40 = numObstacles * 0x18 + 0x14;
    fVar13 = 0.0;
    do {
      if (fVar13 < (__first._M_current[beginPlane].point.val_[2] - result->val_[2]) *
                   __first._M_current[beginPlane].normal.val_[2] +
                   (__first._M_current[beginPlane].point.val_[0] - result->val_[0]) *
                   __first._M_current[beginPlane].normal.val_[0] +
                   (__first._M_current[beginPlane].point.val_[1] - result->val_[1]) *
                   __first._M_current[beginPlane].normal.val_[1]) {
        std::vector<RVO::Plane,std::allocator<RVO::Plane>>::
        vector<__gnu_cxx::__normal_iterator<RVO::Plane_const*,std::vector<RVO::Plane,std::allocator<RVO::Plane>>>,void>
                  ((vector<RVO::Plane,std::allocator<RVO::Plane>> *)&local_70,__first,
                   (Plane *)(((__first._M_current)->point).val_ + local_38 * 2),
                   (allocator_type *)&local_88);
        lVar6 = local_40;
        sVar7 = numObstacles;
        if (numObstacles < beginPlane) {
          do {
            local_88.point.val_[0] = 0.0;
            local_88.point.val_[1] = 0.0;
            local_88.point.val_[2] = 0.0;
            local_88.normal.val_[0] = 0.0;
            local_88.normal.val_[1] = 0.0;
            local_88.normal.val_[2] = 0.0;
            pPVar3 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pPVar4 = pPVar3 + beginPlane;
            fVar13 = (pPVar4->normal).val_[2];
            fVar8 = *(float *)((long)(pPVar3->point).val_ + lVar6);
            uVar1 = *(undefined8 *)(pPVar4->normal).val_;
            fVar10 = (float)uVar1;
            fVar14 = (float)((ulong)uVar1 >> 0x20);
            uVar1 = *(undefined8 *)((long)(pPVar3->point).val_ + lVar6 + -8);
            fVar9 = (float)uVar1;
            fVar12 = (float)((ulong)uVar1 >> 0x20);
            fVar15 = fVar12 * fVar13 - fVar14 * fVar8;
            fVar16 = fVar8 * fVar10 - fVar13 * fVar9;
            fVar17 = fVar9 * fVar14 - fVar10 * fVar12;
            if (fVar17 * fVar17 + fVar15 * fVar15 + fVar16 * fVar16 <= 1e-05) {
              if (fVar13 * fVar8 + fVar10 * fVar9 + fVar12 * fVar14 <= 0.0) {
                uVar1 = *(undefined8 *)(pPVar4->point).val_;
                uVar2 = *(undefined8 *)((long)(pPVar3->point).val_ + lVar6 + -0x14);
                fVar13 = ((float)uVar2 + (float)uVar1) * 0.5;
                fVar10 = ((float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20)) * 0.5;
                local_88.point.val_[2] =
                     ((pPVar4->point).val_[2] + *(float *)((long)(&pPVar3->point + -1) + lVar6)) *
                     0.5;
                goto LAB_001062a5;
              }
            }
            else {
              fVar11 = fVar14 * fVar15 - fVar10 * fVar16;
              local_88.point.val_[2] = (pPVar4->point).val_[2];
              fVar14 = fVar13 * fVar16 - fVar14 * fVar17;
              fVar15 = fVar10 * fVar17 - fVar13 * fVar15;
              uVar1 = *(undefined8 *)(pPVar4->point).val_;
              fVar13 = (float)uVar1;
              fVar10 = (float)((ulong)uVar1 >> 0x20);
              fVar8 = (fVar8 * (*(float *)((long)(&pPVar3->point + -1) + lVar6) -
                               local_88.point.val_[2]) +
                      fVar9 * (*(float *)((long)(pPVar3->point).val_ + lVar6 + -0x14) - fVar13) +
                      fVar12 * (*(float *)((long)(pPVar3->point).val_ + lVar6 + -0x10) - fVar10)) /
                      (fVar8 * fVar11 + fVar9 * fVar14 + fVar12 * fVar15);
              fVar13 = fVar8 * fVar14 + fVar13;
              fVar10 = fVar8 * fVar15 + fVar10;
              local_88.point.val_[2] = fVar11 * fVar8 + local_88.point.val_[2];
LAB_001062a5:
              local_88.point.val_[1] = fVar10;
              local_88.point.val_[0] = fVar13;
              local_88.normal.val_[2] =
                   *(float *)((long)(pPVar3->point).val_ + lVar6) - (pPVar4->normal).val_[2];
              uVar1 = *(undefined8 *)((long)(pPVar3->point).val_ + lVar6 + -8);
              uVar2 = *(undefined8 *)(pPVar4->normal).val_;
              local_88.normal.val_[0] = (float)uVar1 - (float)uVar2;
              fVar13 = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
              local_88.normal.val_[1] =
                   1.0 / SQRT(local_88.normal.val_[2] * local_88.normal.val_[2] +
                              local_88.normal.val_[0] * local_88.normal.val_[0] + fVar13 * fVar13);
              local_88.normal.val_[2] = local_88.normal.val_[2] * local_88.normal.val_[1];
              local_88.normal.val_[0] = local_88.normal.val_[1] * local_88.normal.val_[0];
              local_88.normal.val_[1] = local_88.normal.val_[1] * fVar13;
              std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::push_back(&local_70,&local_88);
            }
            sVar7 = sVar7 + 1;
            lVar6 = lVar6 + 0x18;
          } while (sVar7 < beginPlane);
        }
        local_58 = *(undefined8 *)result->val_;
        uStack_50 = 0;
        fVar13 = result->val_[2];
        sVar7 = linearProgram3(&local_70,radius,
                               &(planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>
                                )._M_impl.super__Vector_impl_data._M_start[beginPlane].normal,true,
                               result);
        if (sVar7 < (ulong)(((long)local_70.
                                   super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_70.
                                   super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555)) {
          result->val_[0] = (float)local_58;
          result->val_[1] = local_58._4_4_;
          result->val_[2] = fVar13;
          fVar9 = local_58._4_4_;
          fVar8 = (float)local_58;
        }
        else {
          fVar8 = result->val_[0];
          fVar9 = result->val_[1];
          fVar13 = result->val_[2];
        }
        __first._M_current =
             (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
             super__Vector_impl_data._M_start;
        fVar12 = __first._M_current[beginPlane].point.val_[1];
        fVar10 = __first._M_current[beginPlane].point.val_[2];
        fVar14 = __first._M_current[beginPlane].normal.val_[1];
        fVar15 = (__first._M_current[beginPlane].point.val_[0] - fVar8) *
                 __first._M_current[beginPlane].normal.val_[0];
        fVar8 = __first._M_current[beginPlane].normal.val_[2];
        if (local_70.super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          local_58 = CONCAT44(local_58._4_4_,fVar15);
          operator_delete(local_70.super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_70.super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_70.super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          __first._M_current =
               (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
               super__Vector_impl_data._M_start;
          fVar15 = (float)local_58;
        }
        fVar13 = (fVar10 - fVar13) * fVar8 + fVar15 + (fVar12 - fVar9) * fVar14;
        pPVar4 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      beginPlane = beginPlane + 1;
    } while (beginPlane <
             (ulong)(((long)pPVar4 - (long)__first._M_current >> 3) * -0x5555555555555555));
  }
  return;
}

Assistant:

void linearProgram4(const std::vector<Plane> &planes, size_t numObstacles, size_t beginPlane, float radius, Vector3 &result)
	{
		float distance = 0.0f;

		for (size_t i = beginPlane; i < planes.size(); ++i) {
			if (planes[i].normal * (planes[i].point - result) > distance) {
				/* Result does not satisfy constraint of plane i. */
				std::vector<Plane> projPlanes(planes.begin(), planes.begin() + static_cast<ptrdiff_t>(numObstacles));

				for (size_t j = numObstacles; j < i; ++j) {
					Plane plane;

					const Vector3 crossProduct = cross(planes[j].normal, planes[i].normal);

					if (absSq(crossProduct) <= RVO_EPSILON) {
						/* Plane i and plane j are (almost) parallel. */
						if (planes[i].normal * planes[j].normal > 0.0f) {
							/* Plane i and plane j point in the same direction. */
							continue;
						}
						else {
							/* Plane i and plane j point in opposite direction. */
							plane.point = 0.5f * (planes[i].point + planes[j].point);
						}
					}
					else {
						/* Plane.point is point on line of intersection between plane i and plane j. */
						const Vector3 lineNormal = cross(crossProduct, planes[i].normal);
						plane.point = planes[i].point + (((planes[j].point - planes[i].point) * planes[j].normal) / (lineNormal * planes[j].normal)) * lineNormal;
					}

					plane.normal = normalize(planes[j].normal - planes[i].normal);
					projPlanes.push_back(plane);
				}

				const Vector3 tempResult = result;

				if (linearProgram3(projPlanes, radius, planes[i].normal, true, result) < projPlanes.size()) {
					/* This should in principle not happen.  The result is by definition already in the feasible region of this linear program. If it fails, it is due to small floating point error, and the current result is kept. */
					result = tempResult;
				}

				distance = planes[i].normal * (planes[i].point - result);
			}
		}
	}